

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  randomx_flags rVar1;
  int i_3;
  int iVar2;
  char acVar3 [4];
  int iVar4;
  randomx_flags rVar5;
  undefined4 extraout_var;
  long lVar6;
  size_t sVar7;
  ostream *poVar8;
  code *pcVar9;
  randomx_argon2_impl *prVar10;
  unsigned_long uVar11;
  long lVar12;
  runtime_error *prVar13;
  undefined8 *puVar14;
  uint uVar15;
  long in_RCX;
  char *pcVar16;
  pointer ptVar17;
  pointer_____offset_0x10___ *ppuVar18;
  randomx_flags rVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  undefined **ppuVar24;
  char cVar25;
  int i;
  undefined4 uVar26;
  ulong unaff_R15;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint local_13c;
  int noncesCount;
  uint32_t count;
  randomx_flags local_130;
  int local_12c;
  long local_128;
  randomx_vm *vm;
  ulong local_118;
  randomx_cache *cache;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> vms;
  uint64_t local_f0;
  int cpuid;
  atomic<unsigned_int> atomicNonce;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  uint32_t startItem;
  undefined4 uStack_b4;
  randomx_dataset *dataset;
  double local_a8;
  double dStack_a0;
  reference_wrapper<std::atomic<unsigned_int>_> local_90;
  undefined4 local_88;
  char seed [4];
  MineFunc *func;
  size_type local_68;
  undefined1 local_60 [16];
  AtomicHash result;
  
  uVar23 = (ulong)(uint)argc;
  if (argc < 1) {
    bVar28 = false;
    local_128 = 0;
    local_a8 = 0.0;
LAB_001084f6:
    acVar3[0] = '\0';
    acVar3[1] = '\0';
    acVar3[2] = '\0';
    acVar3[3] = '\0';
    noncesCount = 1000;
    local_13c = 1;
    local_f0 = 0;
    local_12c = 1;
  }
  else {
    uVar22 = uVar23 - 1;
    uVar27 = 0;
    do {
      iVar2 = strcmp(argv[uVar27],"--softAes");
      in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),iVar2 == 0);
      if (iVar2 == 0) break;
      bVar28 = uVar22 != uVar27;
      uVar27 = uVar27 + 1;
    } while (bVar28);
    uVar27 = 0;
    local_128 = in_RCX;
    do {
      iVar2 = strcmp(argv[uVar27],"--mine");
      local_a8 = (double)CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),iVar2 == 0);
      if (iVar2 == 0) break;
      bVar28 = uVar22 != uVar27;
      uVar27 = uVar27 + 1;
    } while (bVar28);
    uVar27 = 0;
    do {
      iVar2 = strcmp(argv[uVar27],"--verify");
      bVar28 = iVar2 == 0;
      unaff_R15 = uVar27;
      if (bVar28) break;
      unaff_R15 = uVar27 + 1;
      bVar29 = uVar22 != uVar27;
      uVar27 = unaff_R15;
    } while (bVar29);
    if (argc == 1) goto LAB_001084f6;
    uVar22 = (ulong)(argc - 1);
    uVar27 = 0;
    do {
      iVar2 = strcmp(argv[uVar27],"--threads");
      if ((iVar2 == 0) && (local_12c = atoi(argv[uVar27 + 1]), 0 < local_12c)) goto LAB_0010855b;
      uVar27 = uVar27 + 1;
    } while (uVar22 != uVar27);
    local_12c = 1;
LAB_0010855b:
    uVar27 = 0;
    do {
      iVar2 = strcmp(argv[uVar27],"--affinity");
      if ((iVar2 == 0) && (local_f0 = strtoull(argv[uVar27 + 1],(char **)0x0,0), local_f0 != 0))
      goto LAB_001085a0;
      uVar27 = uVar27 + 1;
    } while (uVar22 != uVar27);
    local_f0 = 0;
LAB_001085a0:
    uVar27 = 0;
    do {
      iVar2 = strcmp(argv[uVar27],"--nonces");
      if ((iVar2 == 0) && (noncesCount = atoi(argv[uVar27 + 1]), 0 < noncesCount))
      goto LAB_001085dc;
      uVar27 = uVar27 + 1;
    } while (uVar22 != uVar27);
    noncesCount = 1000;
LAB_001085dc:
    uVar27 = 0;
    do {
      iVar2 = strcmp(argv[uVar27],"--init");
      if ((iVar2 == 0) && (local_13c = atoi(argv[uVar27 + 1]), 0 < (int)local_13c))
      goto LAB_0010861a;
      uVar27 = uVar27 + 1;
    } while (uVar22 != uVar27);
    local_13c = 1;
LAB_0010861a:
    unaff_R15 = 0;
    do {
      iVar2 = strcmp(argv[unaff_R15],"--seed");
      if ((iVar2 == 0) && (acVar3 = (char  [4])atoi(argv[unaff_R15 + 1]), 0 < (int)acVar3))
      goto LAB_00108655;
      unaff_R15 = unaff_R15 + 1;
    } while (uVar22 != unaff_R15);
    acVar3[0] = '\0';
    acVar3[1] = '\0';
    acVar3[2] = '\0';
    acVar3[3] = '\0';
  }
LAB_00108655:
  if (argc < 1) {
    bVar29 = true;
    local_118 = local_118 & 0xffffffff00000000;
    bVar32 = false;
    bVar31 = false;
    bVar30 = false;
    local_130 = RANDOMX_FLAG_DEFAULT;
    uVar26 = 0;
    rVar19 = RANDOMX_FLAG_DEFAULT;
    bVar33 = false;
  }
  else {
    uVar22 = 0;
    lVar6 = local_128;
    do {
      iVar2 = strcmp(argv[uVar22],"--largePages");
      unaff_R15 = CONCAT71((int7)(unaff_R15 >> 8),1);
      rVar19 = (randomx_flags)unaff_R15;
      if (iVar2 == 0) goto LAB_001086b9;
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
    uVar22 = 0;
    do {
      iVar2 = strcmp(argv[uVar22],"--largepages");
      if (iVar2 == 0) goto LAB_001086b9;
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
    rVar19 = RANDOMX_FLAG_DEFAULT;
LAB_001086b9:
    lVar20 = uVar23 - 1;
    lVar12 = 0;
    do {
      iVar2 = strcmp(argv[lVar12],"--jit");
      bVar30 = iVar2 == 0;
      lVar6 = CONCAT71((int7)((ulong)lVar6 >> 8),bVar30);
      if (bVar30) break;
      bVar29 = lVar20 != lVar12;
      lVar12 = lVar12 + 1;
    } while (bVar29);
    lVar12 = 0;
    do {
      iVar2 = strcmp(argv[lVar12],"--help");
      lVar6 = CONCAT71((int7)((ulong)lVar6 >> 8),iVar2 == 0);
      if (iVar2 == 0) break;
      bVar29 = lVar20 != lVar12;
      lVar12 = lVar12 + 1;
    } while (bVar29);
    local_88 = (undefined4)lVar6;
    lVar6 = 0;
    local_130 = rVar19;
    do {
      iVar2 = strcmp(argv[lVar6],"--secure");
      bVar31 = iVar2 == 0;
      if (bVar31) break;
      bVar29 = lVar20 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar29);
    lVar6 = 0;
    do {
      iVar2 = strcmp(argv[lVar6],"--ssse3");
      if (iVar2 == 0) break;
      bVar29 = lVar20 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar29);
    lVar6 = 0;
    do {
      iVar4 = strcmp(argv[lVar6],"--avx2");
      bVar32 = iVar4 == 0;
      if (bVar32) break;
      bVar29 = lVar20 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar29);
    lVar6 = 0;
    do {
      iVar4 = strcmp(argv[lVar6],"--auto");
      bVar33 = iVar4 == 0;
      if (bVar33) break;
      bVar29 = lVar20 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar29);
    lVar6 = 0;
    do {
      iVar4 = strcmp(argv[lVar6],"--noBatch");
      local_118 = CONCAT44(local_118._4_4_,CONCAT31((int3)((uint)iVar4 >> 8),iVar4 == 0));
      if (iVar4 == 0) break;
      bVar29 = lVar20 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar29);
    lVar6 = 0;
    do {
      iVar4 = strcmp(argv[lVar6],"--commit");
      bVar29 = iVar4 != 0;
      if (iVar4 == 0) break;
      bVar34 = lVar20 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar34);
    rVar19 = (uint)(iVar2 == 0) << 5;
    uVar26 = local_88;
  }
  seed = acVar3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RandomX benchmark v1.2.1",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  iVar2 = local_12c;
  rVar1 = local_130;
  if ((char)uVar26 != '\0') {
    printUsage(*argv);
    return 0;
  }
  cVar25 = local_a8._0_1_;
  if (!bVar28 && local_a8._0_1_ == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please select either the fast mode (--mine) or the slow mode (--verify)",0x47);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Run \'",5);
    pcVar16 = *argv;
    if (pcVar16 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x123130);
    }
    else {
      sVar7 = strlen(pcVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," --help\' to see all supported options",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    return 0;
  }
  atomicNonce.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
  lVar6 = 0;
  do {
    LOCK();
    result.hash[lVar6].super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar33) {
    local_13c = std::thread::hardware_concurrency();
    rVar5 = randomx_get_flags();
  }
  else {
    rVar5 = rVar19 + RANDOMX_FLAG_ARGON2_AVX2;
    if (!bVar32) {
      rVar5 = rVar19;
    }
    rVar19 = rVar5 | RANDOMX_FLAG_HARD_AES;
    if ((char)local_128 != '\0') {
      rVar19 = rVar5;
    }
    rVar5 = rVar19 | RANDOMX_FLAG_JIT;
    if (!bVar30) {
      rVar5 = rVar19;
    }
  }
  rVar5 = rVar1 & 0xff | rVar5;
  rVar19 = rVar5 | RANDOMX_FLAG_FULL_MEM;
  if (cVar25 == '\0') {
    rVar19 = rVar5;
  }
  rVar1 = rVar19 | RANDOMX_FLAG_SECURE;
  if (!bVar31) {
    rVar1 = rVar19;
  }
  uVar23 = (ulong)rVar1;
  bVar28 = (rVar1 & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT;
  pcVar16 = " - Argon2 implementation: SSSE3";
  if (bVar28) {
    pcVar16 = " - Argon2 implementation: reference";
  }
  bVar32 = (rVar1 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT;
  pcVar21 = " - Argon2 implementation: AVX2";
  if (bVar32) {
    pcVar21 = pcVar16;
  }
  lVar6 = 0x1e;
  if (bVar32) {
    lVar6 = (ulong)bVar28 * 4 + 0x1f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pcVar16 = " - full memory mode (2080 MiB)";
  if ((rVar1 & RANDOMX_FLAG_FULL_MEM) == RANDOMX_FLAG_DEFAULT) {
    pcVar16 = " - light memory mode (256 MiB)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if ((rVar1 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    lVar6 = 0x13;
    pcVar16 = " - interpreted mode";
LAB_00108b07:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,lVar6);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - JIT compiled mode ",0x15);
    if ((rVar1 & RANDOMX_FLAG_SECURE) != RANDOMX_FLAG_DEFAULT) {
      lVar6 = 8;
      pcVar16 = "(secure)";
      goto LAB_00108b07;
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pcVar16 = " - hardware AES mode";
  if ((rVar1 & RANDOMX_FLAG_HARD_AES) == RANDOMX_FLAG_DEFAULT) {
    pcVar16 = " - software AES mode";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pcVar16 = " - large pages mode";
  if ((rVar1 & RANDOMX_FLAG_LARGE_PAGES) == RANDOMX_FLAG_DEFAULT) {
    pcVar16 = " - small pages mode";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if (local_f0 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - thread affinity (",0x14);
    mask_to_string_abi_cxx11_((string *)&func,local_f0);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)func,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (func != (MineFunc *)local_60) {
      operator_delete(func);
    }
  }
  if ((char)local_118 == '\0') {
    if (!bVar29) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," - hash commitments",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      goto LAB_00108dfd;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - batch mode",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    pcVar9 = mine<true,false>;
  }
  else if (bVar29) {
    pcVar9 = mine<false,false>;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - hash commitments",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
LAB_00108dfd:
    pcVar9 = mine<false,true>;
  }
  func = pcVar9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing",0xc);
  if (cVar25 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," thread",7);
    pcVar16 = ")";
    if (1 < (int)local_13c) {
      pcVar16 = "s)";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,pcVar16,(ulong)(1 < (int)local_13c) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ...",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if ((rVar1 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    if ((rVar1 & RANDOMX_FLAG_ARGON2_SSSE3) != RANDOMX_FLAG_DEFAULT) {
      prVar10 = randomx_argon2_impl_ssse3();
      goto LAB_00108eed;
    }
  }
  else {
    prVar10 = randomx_argon2_impl_avx2();
LAB_00108eed:
    if (prVar10 == (randomx_argon2_impl *)0x0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar13,"Unsupported Argon2 implementation");
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if ((rVar1 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "WARNING: You are using the interpreter mode. Use --jit for optimal performance.",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  lVar6 = std::chrono::_V2::system_clock::now();
  cache = randomx_alloc_cache(rVar1);
  if (cache == (randomx_cache *)0x0) {
    ppuVar18 = &CacheAllocException::typeinfo;
    ppuVar24 = &PTR__exception_0011fef0;
LAB_0010971f:
    puVar14 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar14 = ppuVar24;
    __cxa_throw(puVar14,ppuVar18,std::exception::~exception);
  }
  randomx_init_cache(cache,seed,4);
  if (cVar25 != '\0') {
    dataset = randomx_alloc_dataset(rVar1);
    if (dataset == (randomx_dataset *)0x0) {
      ppuVar18 = &DatasetAllocException::typeinfo;
      ppuVar24 = &PTR__exception_0011ff18;
      dataset = (randomx_dataset *)0x0;
      goto LAB_0010971f;
    }
    uVar11 = randomx_dataset_item_count();
    if ((int)local_13c < 2) {
      randomx_init_dataset(dataset,cache,0,uVar11 & 0xffffffff);
    }
    else {
      local_118 = CONCAT44(local_118._4_4_,rVar1);
      uVar23 = (ulong)local_13c;
      _startItem = (AtomicHash *)((ulong)_startItem & 0xffffffff00000000);
      local_128 = lVar6;
      do {
        iVar2 = 0;
        if (local_13c == 1) {
          iVar2 = (int)((uVar11 & 0xffffffff) % uVar23);
        }
        count = iVar2 + (int)((uVar11 & 0xffffffff) / uVar23);
        local_90._M_data = (atomic<unsigned_int> *)randomx_init_dataset;
        std::thread::
        thread<void(*)(randomx_dataset*,randomx_cache*,unsigned_long,unsigned_long),randomx_dataset*&,randomx_cache*&,unsigned_int&,unsigned_int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_dataset_ptr_randomx_cache_ptr_unsigned_long_unsigned_long **)
                   &local_90,&dataset,&cache,&startItem,&count);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        iVar2 = local_12c;
        if (vm != (randomx_vm *)0x0) {
          std::terminate();
        }
        startItem = startItem + count;
        local_13c = local_13c - 1;
      } while (local_13c != 0);
      cVar25 = SUB81(local_a8,0);
      uVar23 = local_118 & 0xffffffff;
      lVar6 = local_128;
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar22 = 1;
        do {
          std::thread::join();
          bVar28 = uVar22 < (ulong)((long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar22 = (ulong)((int)uVar22 + 1);
          lVar6 = local_128;
        } while (bVar28);
      }
    }
    randomx_release_cache(cache);
    cache = (randomx_cache *)0x0;
    ptVar17 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        if ((ptVar17->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar17 = ptVar17 + 1;
      } while (ptVar17 !=
               threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Memory initialized in ",0x16);
  lVar12 = std::chrono::_V2::system_clock::now();
  lVar12 = lVar12 - lVar6;
  auVar36._8_4_ = (int)((ulong)lVar12 >> 0x20);
  auVar36._0_8_ = lVar12;
  auVar36._12_4_ = 0x45300000;
  poVar8 = std::ostream::_M_insert<double>
                     (((auVar36._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
                      1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," s",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing ",0xd);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," virtual machine(s) ...",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  iVar4 = 1;
  if (1 < iVar2) {
    iVar4 = iVar2;
  }
  do {
    vm = randomx_create_vm((randomx_flags)uVar23,cache,dataset);
    if (vm == (randomx_vm *)0x0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      if ((uVar23 & 2) == 0) {
        if ((undefined1)local_130 == '\0') {
          std::runtime_error::runtime_error(prVar13,"Cannot create VM");
        }
        else {
          std::runtime_error::runtime_error
                    (prVar13,"Cannot create VM with the selected options. Try without --largePages")
          ;
        }
      }
      else {
        std::runtime_error::runtime_error
                  (prVar13,"Cannot create VM with the selected options. Try using --softAes");
      }
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<randomx_vm*,std::allocator<randomx_vm*>>::_M_realloc_insert<randomx_vm*const&>
                ((vector<randomx_vm*,std::allocator<randomx_vm*>> *)&vms,
                 (iterator)
                 vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&vm);
    }
    else {
      *vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
       super__Vector_impl_data._M_finish = vm;
      vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running benchmark (",0x13);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,noncesCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," nonces) ...",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  uVar23 = std::chrono::_V2::system_clock::now();
  if (iVar2 < 2) {
    (*func)(*vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
             super__Vector_impl_data._M_start,&atomicNonce,&result,noncesCount,0,-1);
  }
  else {
    count = 0;
    local_118 = uVar23;
    if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar23 = 0;
      do {
        cpuid = -1;
        uVar15 = (uint)uVar23;
        if (local_f0 != 0) {
          cpuid = cpuid_from_mask(local_f0,&count);
          uVar15 = count;
        }
        local_90._M_data = &atomicNonce;
        _startItem = &result;
        std::thread::
        thread<void(*&)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*&,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int&,unsigned_int&,int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_vm_ptr_atomic<unsigned_int>_ptr_AtomicHash_ptr_uint_int_int
                    **)&func,
                   vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15,&local_90,
                   (reference_wrapper<AtomicHash> *)&startItem,&noncesCount,&count,&cpuid);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        if (vm != (randomx_vm *)0x0) {
          std::terminate();
        }
        count = count + 1;
        uVar23 = (ulong)count;
      } while (uVar23 < (ulong)((long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    uVar23 = local_118;
    cVar25 = SUB81(local_a8,0);
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar22 = 1;
      do {
        std::thread::join();
        bVar28 = uVar22 < (ulong)((long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar22 = (ulong)((int)uVar22 + 1);
      } while (bVar28);
    }
  }
  lVar6 = std::chrono::_V2::system_clock::now();
  if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar22 = 0;
    uVar27 = 1;
    do {
      randomx_destroy_vm(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar22]);
      bVar28 = uVar27 < (ulong)((long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar22 = uVar27;
      uVar27 = (ulong)((int)uVar27 + 1);
    } while (bVar28);
  }
  if (cVar25 == '\0') {
    randomx_release_cache(cache);
  }
  else {
    randomx_release_dataset(dataset);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calculated result: ",0x13);
  AtomicHash::print(&result,(ostream *)&std::cout);
  if (noncesCount == 1000 && acVar3 == (char  [4])0x0) {
    if (!bVar29) goto LAB_0010951e;
    pcVar16 = "Reference result:  2ef524aee58abcceeb488b28116f6d357411788ded7bdff2fed07002ce7ae987";
  }
  else {
    if (!(bool)(bVar29 & (acVar3 == (char  [4])0x0 && noncesCount == 10))) goto LAB_0010951e;
    pcVar16 = "Reference result:  8416fe0d17607f6ec811e7b7dfcf6cd384f7ef3cbfb9ff56ef906a918c9d9b0d";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,0x53);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
LAB_0010951e:
  lVar6 = lVar6 - uVar23;
  auVar35._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar35._0_8_ = lVar6;
  auVar35._12_4_ = 0x45300000;
  dStack_a0 = auVar35._8_8_ - 1.9342813113834067e+25;
  local_a8 = (dStack_a0 + ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
             1000000000.0;
  if (cVar25 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performance: ",0xd);
    poVar8 = std::ostream::_M_insert<double>((local_a8 * 1000.0) / (double)noncesCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms per hash",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performance: ",0xd);
    poVar8 = std::ostream::_M_insert<double>((double)noncesCount / local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," hashes per second",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, miningMode, verificationMode, help, largePages, jit, secure, commit;
	bool ssse3, avx2, autoFlags, noBatch;
	int noncesCount, threadCount, initThreadCount;
	uint64_t threadAffinity;
	int32_t seedValue;
	char seed[4];

	readOption("--softAes", argc, argv, softAes);
	readOption("--mine", argc, argv, miningMode);
	readOption("--verify", argc, argv, verificationMode);
	readIntOption("--threads", argc, argv, threadCount, 1);
	readUInt64Option("--affinity", argc, argv, threadAffinity, 0);
	readIntOption("--nonces", argc, argv, noncesCount, 1000);
	readIntOption("--init", argc, argv, initThreadCount, 1);
	readIntOption("--seed", argc, argv, seedValue, 0);
	readOption("--largePages", argc, argv, largePages);
	if (!largePages) {
		readOption("--largepages", argc, argv, largePages);
	}
	readOption("--jit", argc, argv, jit);
	readOption("--help", argc, argv, help);
	readOption("--secure", argc, argv, secure);
	readOption("--ssse3", argc, argv, ssse3);
	readOption("--avx2", argc, argv, avx2);
	readOption("--auto", argc, argv, autoFlags);
	readOption("--noBatch", argc, argv, noBatch);
	readOption("--commit", argc, argv, commit);

	store32(&seed, seedValue);

	std::cout << "RandomX benchmark v1.2.1" << std::endl;

	if (help) {
		printUsage(argv[0]);
		return 0;
	}

	if (!miningMode && !verificationMode) {
		std::cout << "Please select either the fast mode (--mine) or the slow mode (--verify)" << std::endl;
		std::cout << "Run '" << argv[0] << " --help' to see all supported options" << std::endl;
		return 0;
	}

	std::atomic<uint32_t> atomicNonce(0);
	AtomicHash result;
	std::vector<randomx_vm*> vms;
	std::vector<std::thread> threads;
	randomx_dataset* dataset;
	randomx_cache* cache;
	randomx_flags flags;

	if (autoFlags) {
		initThreadCount = std::thread::hardware_concurrency();
		flags = randomx_get_flags();
	}
	else {
		flags = RANDOMX_FLAG_DEFAULT;
		if (ssse3) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		if (avx2) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (!softAes) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (jit) {
			flags |= RANDOMX_FLAG_JIT;
#ifdef RANDOMX_FORCE_SECURE
			flags |= RANDOMX_FLAG_SECURE;
#endif
		}
	}

	if (largePages) {
		flags |= RANDOMX_FLAG_LARGE_PAGES;
	}
	if (miningMode) {
		flags |= RANDOMX_FLAG_FULL_MEM;
	}
#ifndef RANDOMX_FORCE_SECURE
	if (secure) {
		flags |= RANDOMX_FLAG_SECURE;
	}
#endif

	if (flags & RANDOMX_FLAG_ARGON2_AVX2) {
		std::cout << " - Argon2 implementation: AVX2" << std::endl;
	}
	else if (flags & RANDOMX_FLAG_ARGON2_SSSE3) {
		std::cout << " - Argon2 implementation: SSSE3" << std::endl;
	}
	else {
		std::cout << " - Argon2 implementation: reference" << std::endl;
	}

	if (flags & RANDOMX_FLAG_FULL_MEM) {
		std::cout << " - full memory mode (2080 MiB)" << std::endl;
	}
	else {
		std::cout << " - light memory mode (256 MiB)" << std::endl;
	}

	if (flags & RANDOMX_FLAG_JIT) {
		std::cout << " - JIT compiled mode ";
		if (flags & RANDOMX_FLAG_SECURE) {
			std::cout << "(secure)";
		}
		std::cout << std::endl;
	}
	else {
		std::cout << " - interpreted mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_HARD_AES) {
		std::cout << " - hardware AES mode" << std::endl;
	}
	else {
		std::cout << " - software AES mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_LARGE_PAGES) {
		std::cout << " - large pages mode" << std::endl;
	}
	else {
		std::cout << " - small pages mode" << std::endl;
	}

	if (threadAffinity) {
		std::cout << " - thread affinity (" << mask_to_string(threadAffinity) << ")" << std::endl;
	}

	MineFunc* func;

	if (noBatch) {
		if (commit) {
			std::cout << " - hash commitments" << std::endl;
			func = &mine<false, true>;
		}
		else {
			func = &mine<false, false>;
		}
	}
	else {
		if (commit) {
			//TODO: support batch mode with commitments
			std::cout << " - hash commitments" << std::endl;
			func = &mine<false, true>;
		}
		else {
			std::cout << " - batch mode" << std::endl;
			func = &mine<true, false>;
		}
	}

	std::cout << "Initializing";
	if (miningMode)
		std::cout << " (" << initThreadCount << " thread" << (initThreadCount > 1 ? "s)" : ")");
	std::cout << " ..." << std::endl;

	try {
		if (nullptr == randomx::selectArgonImpl(flags)) {
			throw std::runtime_error("Unsupported Argon2 implementation");
		}
		if ((flags & RANDOMX_FLAG_JIT) && !RANDOMX_HAVE_COMPILER) {
			throw std::runtime_error("JIT compilation is not supported on this platform. Try without --jit");
		}
		if (!(flags & RANDOMX_FLAG_JIT) && RANDOMX_HAVE_COMPILER) {
			std::cout << "WARNING: You are using the interpreter mode. Use --jit for optimal performance." << std::endl;
		}

		Stopwatch sw(true);
		cache = randomx_alloc_cache(flags);
		if (cache == nullptr) {
			throw CacheAllocException();
		}
		randomx_init_cache(cache, &seed, sizeof(seed));
		if (miningMode) {
			dataset = randomx_alloc_dataset(flags);
			if (dataset == nullptr) {
				throw DatasetAllocException();
			}
			uint32_t datasetItemCount = randomx_dataset_item_count();
			if (initThreadCount > 1) {
				auto perThread = datasetItemCount / initThreadCount;
				auto remainder = datasetItemCount % initThreadCount;
				uint32_t startItem = 0;
				for (int i = 0; i < initThreadCount; ++i) {
					auto count = perThread + (i == initThreadCount - 1 ? remainder : 0);
					threads.push_back(std::thread(&randomx_init_dataset, dataset, cache, startItem, count));
					startItem += count;
				}
				for (unsigned i = 0; i < threads.size(); ++i) {
					threads[i].join();
				}
			}
			else {
				randomx_init_dataset(dataset, cache, 0, datasetItemCount);
			}
			randomx_release_cache(cache);
			cache = nullptr;
			threads.clear();
		}
		std::cout << "Memory initialized in " << sw.getElapsed() << " s" << std::endl;
		std::cout << "Initializing " << threadCount << " virtual machine(s) ..." << std::endl;
		for (int i = 0; i < threadCount; ++i) {
			randomx_vm *vm = randomx_create_vm(flags, cache, dataset);
			if (vm == nullptr) {
				if ((flags & RANDOMX_FLAG_HARD_AES)) {
					throw std::runtime_error("Cannot create VM with the selected options. Try using --softAes");
				}
				if (largePages) {
					throw std::runtime_error("Cannot create VM with the selected options. Try without --largePages");
				}
				throw std::runtime_error("Cannot create VM");
			}
			vms.push_back(vm);
		}
		std::cout << "Running benchmark (" << noncesCount << " nonces) ..." << std::endl;
		sw.restart();
		if (threadCount > 1) {
			for (unsigned i = 0; i < vms.size(); ++i) {
				int cpuid = -1;
				if (threadAffinity)
					cpuid = cpuid_from_mask(threadAffinity, i);
				threads.push_back(std::thread(func, vms[i], std::ref(atomicNonce), std::ref(result), noncesCount, i, cpuid));
			}
			for (unsigned i = 0; i < threads.size(); ++i) {
				threads[i].join();
			}
		}
		else {
			func(vms[0], std::ref(atomicNonce), std::ref(result), noncesCount, 0, -1);
		}

		double elapsed = sw.getElapsed();
		for (unsigned i = 0; i < vms.size(); ++i)
			randomx_destroy_vm(vms[i]);
		if (miningMode)
			randomx_release_dataset(dataset);
		else
			randomx_release_cache(cache);
		std::cout << "Calculated result: ";
		result.print(std::cout);
		if (noncesCount == 1000 && seedValue == 0 && !commit)
			std::cout << "Reference result:  2ef524aee58abcceeb488b28116f6d357411788ded7bdff2fed07002ce7ae987" << std::endl;
		else if (noncesCount == 10 && seedValue == 0 && !commit)
			std::cout << "Reference result:  8416fe0d17607f6ec811e7b7dfcf6cd384f7ef3cbfb9ff56ef906a918c9d9b0d" << std::endl;
		if (!miningMode) {
			std::cout << "Performance: " << 1000 * elapsed / noncesCount << " ms per hash" << std::endl;
		}
		else {
			std::cout << "Performance: " << noncesCount / elapsed << " hashes per second" << std::endl;
		}
	}
	catch (MemoryException& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		if (largePages) {
#ifdef _WIN32
			std::cout << "To use large pages, please enable the \"Lock Pages in Memory\" policy and reboot." << std::endl;
			if (!IsWindows8OrGreater()) {
				std::cout << "Additionally, you have to run the benchmark from elevated command prompt." << std::endl;
			}
#else
			std::cout << "To use large pages, please run: sudo sysctl -w vm.nr_hugepages=1250" << std::endl;
#endif
		}
		return 1;
	}
	catch (std::exception& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		return 1;
	}
	return 0;
}